

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O2

OStream * Json::operator<<(OStream *sout,Value *root)

{
  StreamWriter *pSVar1;
  StreamWriterBuilder builder;
  StreamWriterBuilder SStack_48;
  
  StreamWriterBuilder::StreamWriterBuilder(&SStack_48);
  pSVar1 = StreamWriterBuilder::newStreamWriter(&SStack_48);
  (*pSVar1->_vptr_StreamWriter[2])(pSVar1,root,sout);
  (*pSVar1->_vptr_StreamWriter[1])(pSVar1);
  StreamWriterBuilder::~StreamWriterBuilder(&SStack_48);
  return sout;
}

Assistant:

OStream& operator<<(OStream& sout, Value const& root) {
  StreamWriterBuilder builder;
  StreamWriterPtr const writer(builder.newStreamWriter());
  writer->write(root, &sout);
  return sout;
}